

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall FIX::CharField::CharField(CharField *this,int field)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  FieldBase::FieldBase(&this->super_FieldBase,field,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00170f68;
  return;
}

Assistant:

CharField( int field )
: FieldBase( field, "" ) {}